

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

wchar_t main(wchar_t argc,char **argv)

{
  int iVar1;
  ulong in_RAX;
  GLFWmonitor *monitor;
  GLFWwindow *handle;
  wchar_t height;
  wchar_t width;
  undefined8 local_28;
  
  local_28 = in_RAX;
  setlocale(6,"");
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    puts("Library initialized");
    monitor = (GLFWmonitor *)0x0;
    do {
      while (iVar1 = getopt(argc,argv,"f"), iVar1 == 0x66) {
        monitor = glfwGetPrimaryMonitor();
      }
    } while (iVar1 != -1);
    handle = glfwCreateWindow(0x280,0x1e0,"Event Linter",monitor,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      puts("Window opened");
      glfwSetMonitorCallback(monitor_callback);
      glfwSetWindowPosCallback(handle,window_pos_callback);
      glfwSetWindowSizeCallback(handle,window_size_callback);
      glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
      glfwSetWindowCloseCallback(handle,window_close_callback);
      glfwSetWindowRefreshCallback(handle,window_refresh_callback);
      glfwSetWindowFocusCallback(handle,window_focus_callback);
      glfwSetWindowIconifyCallback(handle,window_iconify_callback);
      glfwSetMouseButtonCallback(handle,mouse_button_callback);
      glfwSetCursorPosCallback(handle,cursor_position_callback);
      glfwSetCursorEnterCallback(handle,cursor_enter_callback);
      glfwSetScrollCallback(handle,scroll_callback);
      glfwSetKeyCallback(handle,key_callback);
      glfwSetCharCallback(handle,char_callback);
      glfwMakeContextCurrent(handle);
      glfwSwapInterval(1);
      glfwGetWindowSize(handle,(int *)((long)&local_28 + 4),(int *)&local_28);
      printf("Window size should be %ix%i\n",local_28 >> 0x20,local_28 & 0xffffffff);
      puts("Main loop starting");
      iVar1 = glfwWindowShouldClose(handle);
      while (iVar1 == 0) {
        glfwWaitEvents();
        fflush(_stdout);
        iVar1 = glfwWindowShouldClose(handle);
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;
    GLFWmonitor* monitor = NULL;
    int ch, width, height;

    setlocale(LC_ALL, "");

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    printf("Library initialized\n");

    while ((ch = getopt(argc, argv, "f")) != -1)
    {
        switch (ch)
        {
            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;
        }
    }

    window = glfwCreateWindow(640, 480, "Event Linter", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    printf("Window opened\n");

    glfwSetMonitorCallback(monitor_callback);

    glfwSetWindowPosCallback(window, window_pos_callback);
    glfwSetWindowSizeCallback(window, window_size_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetWindowCloseCallback(window, window_close_callback);
    glfwSetWindowRefreshCallback(window, window_refresh_callback);
    glfwSetWindowFocusCallback(window, window_focus_callback);
    glfwSetWindowIconifyCallback(window, window_iconify_callback);
    glfwSetMouseButtonCallback(window, mouse_button_callback);
    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetCursorEnterCallback(window, cursor_enter_callback);
    glfwSetScrollCallback(window, scroll_callback);
    glfwSetKeyCallback(window, key_callback);
    glfwSetCharCallback(window, char_callback);

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    glfwGetWindowSize(window, &width, &height);
    printf("Window size should be %ix%i\n", width, height);

    printf("Main loop starting\n");

    while (!glfwWindowShouldClose(window))
    {
        glfwWaitEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}